

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void do_restart_interrupt(CPUS390XState_conflict *env)

{
  LowCore *lowcore_00;
  uint64_t uVar1;
  uint64_t addr_00;
  LowCore *lowcore;
  uint64_t addr;
  uint64_t mask;
  CPUS390XState_conflict *env_local;
  
  lowcore_00 = cpu_map_lowcore(env);
  uVar1 = get_psw_mask(env);
  uVar1 = cpu_to_be64(uVar1);
  (lowcore_00->restart_old_psw).mask = uVar1;
  uVar1 = cpu_to_be64((env->psw).addr);
  (lowcore_00->restart_old_psw).addr = uVar1;
  uVar1 = be64_to_cpu((lowcore_00->restart_new_psw).mask);
  addr_00 = be64_to_cpu((lowcore_00->restart_new_psw).addr);
  cpu_unmap_lowcore(env,lowcore_00);
  env->pending_int = env->pending_int & 0xffffff7f;
  load_psw(env,uVar1,addr_00);
  return;
}

Assistant:

void do_restart_interrupt(CPUS390XState *env)
{
    uint64_t mask, addr;
    LowCore *lowcore;

    lowcore = cpu_map_lowcore(env);

    lowcore->restart_old_psw.mask = cpu_to_be64(get_psw_mask(env));
    lowcore->restart_old_psw.addr = cpu_to_be64(env->psw.addr);
    mask = be64_to_cpu(lowcore->restart_new_psw.mask);
    addr = be64_to_cpu(lowcore->restart_new_psw.addr);

    cpu_unmap_lowcore(env, lowcore);
    env->pending_int &= ~INTERRUPT_RESTART;

    load_psw(env, mask, addr);
}